

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

VariableIndex __thiscall
cnn::ComputationGraph::add_const_lookup(ComputationGraph *this,LookupParameters *p,uint index)

{
  _func_int **pp_Var1;
  pointer pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  uint in_ECX;
  undefined4 in_register_00000014;
  Node *local_28;
  
  pp_Var1 = (_func_int **)CONCAT44(in_register_00000014,index);
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)(*(long *)(p->dim).d - (long)(p->super_ParametersBase)._vptr_ParametersBase) >>
            3);
  local_28 = (Node *)operator_new(0xa8);
  (local_28->dim).nd = 0;
  (local_28->dim).bd = 1;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28->_vptr_Node = (_func_int **)&PTR__LookupNode_003a61e8;
  pVVar2 = (pointer)pp_Var1[2];
  pVVar3 = (pointer)pp_Var1[3];
  pVVar4 = (pointer)pp_Var1[4];
  local_28[1]._vptr_Node = (_func_int **)pp_Var1[1];
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar2;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar3;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar4;
  local_28[1].dim.d[0] = *(uint *)(pp_Var1 + 5);
  local_28[1].dim.d[1] = in_ECX;
  *(uint **)(local_28[1].dim.d + 2) = local_28[1].dim.d + 1;
  local_28[1].dim.d[4] = 0;
  local_28[1].dim.d[5] = 0;
  *(undefined8 *)(local_28[1].dim.d + 6) = 0;
  *(undefined8 *)&local_28[1].dim.bd = 0;
  local_28[1].aux_mem = (void *)0x0;
  local_28[2]._vptr_Node = pp_Var1;
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)p,&local_28);
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_const_lookup(LookupParameters* p, unsigned index) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, index);
  nodes.push_back(new_node);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}